

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTim.c
# Opt level: O3

Vec_Flt_t * Abc_NtkTestCreateRequired(int nOutputs)

{
  Vec_Flt_t *pVVar1;
  float *__ptr;
  int iVar2;
  ulong uVar3;
  int iVar4;
  size_t __size;
  
  pVVar1 = (Vec_Flt_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < nOutputs - 1U) {
    iVar4 = nOutputs;
  }
  pVVar1->nSize = 0;
  pVVar1->nCap = iVar4;
  if (iVar4 == 0) {
    __ptr = (float *)0x0;
  }
  else {
    __ptr = (float *)malloc((long)iVar4 << 2);
  }
  pVVar1->pArray = __ptr;
  if (0 < nOutputs) {
    __size = 0;
    iVar2 = 0;
    uVar3 = 0;
    do {
      if ((int)uVar3 == iVar4) {
        if (uVar3 < 0x10) {
          if (__ptr == (float *)0x0) {
            __ptr = (float *)malloc(0x40);
          }
          else {
            __ptr = (float *)realloc(__ptr,0x40);
          }
          pVVar1->pArray = __ptr;
          iVar4 = 0x10;
        }
        else {
          if (__ptr == (float *)0x0) {
            __ptr = (float *)malloc(__size);
          }
          else {
            __ptr = (float *)realloc(__ptr,__size);
          }
          pVVar1->pArray = __ptr;
          iVar4 = iVar2;
        }
      }
      __ptr[uVar3] = (float)((int)uVar3 + 100);
      uVar3 = uVar3 + 1;
      iVar2 = iVar2 + 2;
      __size = __size + 8;
    } while (nOutputs != (int)uVar3);
    pVVar1->nSize = (int)uVar3;
    pVVar1->nCap = iVar4;
  }
  return pVVar1;
}

Assistant:

Vec_Flt_t * Abc_NtkTestCreateRequired( int nOutputs )
{
    Vec_Flt_t * p;
    int i;
    p = Vec_FltAlloc( nOutputs );
    for ( i = 0; i < nOutputs; i++ )
        Vec_FltPush( p, 100.0 + 1.0*i );
    return p;
}